

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_join.cpp
# Opt level: O3

idx_t __thiscall duckdb::PositionalJoinGlobalState::Refill(PositionalJoinGlobalState *this)

{
  DataChunk *this_00;
  ulong uVar1;
  reference this_01;
  size_type __n;
  ulong uVar2;
  
  uVar2 = (this->source).count;
  uVar1 = this->source_offset;
  this_00 = &this->source;
  if (uVar2 <= uVar1) {
    if (this->exhausted == false) {
      DataChunk::Reset(this_00);
      ColumnDataCollection::Scan(&this->rhs,&this->scan_state,this_00);
      uVar2 = (this->source).count;
    }
    this->source_offset = 0;
    uVar1 = 0;
  }
  if ((uVar2 - uVar1 == 0) && (this->exhausted == false)) {
    DataChunk::Reset(this_00);
    if ((this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        this_01 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n);
        Vector::SetVectorType(this_01,CONSTANT_VECTOR);
        ConstantVector::SetNull(this_01,true);
        __n = __n + 1;
      } while (__n < (ulong)(((long)(this->source).data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->source).data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
    }
    this->exhausted = true;
  }
  return uVar2 - uVar1;
}

Assistant:

idx_t PositionalJoinGlobalState::Refill() {
	if (source_offset >= source.size()) {
		if (!exhausted) {
			source.Reset();
			rhs.Scan(scan_state, source);
		}
		source_offset = 0;
	}

	const auto available = source.size() - source_offset;
	if (!available) {
		if (!exhausted) {
			source.Reset();
			for (idx_t i = 0; i < source.ColumnCount(); ++i) {
				auto &vec = source.data[i];
				vec.SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(vec, true);
			}
			exhausted = true;
		}
	}

	return available;
}